

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::adjustSize(QWindow *this)

{
  long lVar1;
  bool bVar2;
  QSizeF *in_RDI;
  long in_FS_OFFSET;
  QSizeF sz;
  QSizeF *this_00;
  QSizeF *in_stack_ffffffffffffffd8;
  SizeHint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI + 2;
  QSizeF::QSizeF((QSizeF *)&stack0xffffffffffffffd8);
  QGraphicsLayoutItem::effectiveSizeHint
            ((QGraphicsLayoutItem *)0xffffffffffffffff,in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffd8);
  bVar2 = QSizeF::isValid((QSizeF *)&stack0xffffffffffffffe8);
  if (bVar2) {
    resize((QWindow *)this_00,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidget::adjustSize()
{
    QSizeF sz = effectiveSizeHint(Qt::PreferredSize);
    // What if sz is not valid?!
    if (sz.isValid())
        resize(sz);
}